

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetectorOutput.h
# Opt level: O1

void __thiscall DetectorOutput::DetectorOutput(DetectorOutput *this,char *detector)

{
  element_type *peVar1;
  Detector *pDVar2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  long lVar5;
  undefined4 extraout_var;
  Detector *pDVar6;
  runtime_error *prVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  char *_argv;
  char *local_20;
  
  (this->tls)._M_h._M_buckets = &(this->tls)._M_h._M_single_bucket;
  (this->tls)._M_h._M_bucket_count = 1;
  (this->tls)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tls)._M_h._M_element_count = 0;
  (this->tls)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tls)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tls)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  p_Var4->_M_use_count = 1;
  p_Var4->_M_weak_count = 1;
  p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011ec30;
  p_Var4[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var4[1]._M_use_count = 0;
  p_Var4[1]._M_weak_count = 0;
  p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR__UnixLibLoader_0011ece0;
  p_Var4[1]._M_use_count = 0;
  p_Var4[1]._M_weak_count = 0;
  (this->_libdetector).super___shared_ptr<util::LibraryLoader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var4 + 1);
  (this->_libdetector).super___shared_ptr<util::LibraryLoader,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var4;
  (this->_det)._M_t.super___uniq_ptr_impl<Detector,_std::default_delete<Detector>_>._M_t.
  super__Tuple_impl<0UL,_Detector_*,_std::default_delete<Detector>_>.
  super__Head_base<0UL,_Detector_*,_false>._M_head_impl = (Detector *)0x0;
  lVar5._0_4_ = p_Var4[1]._M_use_count;
  lVar5._4_4_ = p_Var4[1]._M_weak_count;
  if (lVar5 == 0) {
    lVar5 = dlopen(detector,2);
    p_Var4[1]._M_use_count = (int)lVar5;
    p_Var4[1]._M_weak_count = (int)((ulong)lVar5 >> 0x20);
    if (lVar5 != 0) {
      peVar1 = (this->_libdetector).
               super___shared_ptr<util::LibraryLoader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar3 = (*peVar1->_vptr_LibraryLoader[5])(peVar1,"CreateDetector");
      if ((code *)CONCAT44(extraout_var,iVar3) != (code *)0x0) {
        pDVar6 = (Detector *)(*(code *)CONCAT44(extraout_var,iVar3))();
        pDVar2 = (this->_det)._M_t.super___uniq_ptr_impl<Detector,_std::default_delete<Detector>_>.
                 _M_t.super__Tuple_impl<0UL,_Detector_*,_std::default_delete<Detector>_>.
                 super__Head_base<0UL,_Detector_*,_false>._M_head_impl;
        (this->_det)._M_t.super___uniq_ptr_impl<Detector,_std::default_delete<Detector>_>._M_t.
        super__Tuple_impl<0UL,_Detector_*,_std::default_delete<Detector>_>.
        super__Head_base<0UL,_Detector_*,_false>._M_head_impl = pDVar6;
        if (pDVar2 != (Detector *)0x0) {
          (**(code **)(*(long *)pDVar2 + 0x10))();
        }
        local_20 = "";
        pDVar2 = (this->_det)._M_t.super___uniq_ptr_impl<Detector,_std::default_delete<Detector>_>.
                 _M_t.super__Tuple_impl<0UL,_Detector_*,_std::default_delete<Detector>_>.
                 super__Head_base<0UL,_Detector_*,_false>._M_head_impl;
        (*(code *)**(undefined8 **)pDVar2)(pDVar2,1,&local_20,callback,0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"init_done\n",10);
        return;
      }
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"could not bind detector");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar7,"could not load library");
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

explicit DetectorOutput(const char* detector) {
    if (!_libdetector->load(detector)) {
      throw std::runtime_error("could not load library");
    }
    decltype(CreateDetector)* create_detector =
        (*_libdetector)["CreateDetector"];
    if (nullptr == create_detector) {
      throw std::runtime_error("could not bind detector");
    }
    _det = std::unique_ptr<Detector>(create_detector());

    const char* _argv = "";
    _det->init(1, &_argv, callback, nullptr);

    std::cout << "init_done\n";
  }